

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O0

void ecx_esidump(ecx_contextt *context,uint16 slave,uint8 *esibuf)

{
  uint8 uVar1;
  uint16 configadr_00;
  uint64 uVar2;
  bool local_4a;
  uint8 eectl;
  uint64 edat;
  uint16 *p16;
  uint64 *p64;
  int local_28;
  int iStack_24;
  uint16 configadr;
  int incr;
  int address;
  uint8 *esibuf_local;
  uint16 slave_local;
  ecx_contextt *context_local;
  
  uVar1 = context->slavelist[slave].eep_pdi;
  ecx_eeprom2master(context,slave);
  configadr_00 = context->slavelist[slave].configadr;
  iStack_24 = 0x40;
  edat = (uint64)esibuf;
  if (context->slavelist[slave].eep_8byte == '\0') {
    local_28 = 2;
  }
  else {
    local_28 = 4;
  }
  do {
    uVar2 = ecx_readeepromFP(context,configadr_00,(uint16)iStack_24,20000);
    *(uint64 *)edat = uVar2;
    edat = edat + (long)local_28 * 2;
    iStack_24 = local_28 + iStack_24;
    local_4a = iStack_24 < 0x801 && (int)uVar2 != -1;
  } while (local_4a);
  if (uVar1 != '\0') {
    ecx_eeprom2pdi(context,slave);
  }
  return;
}

Assistant:

void ecx_esidump(ecx_contextt *context, uint16 slave, uint8 *esibuf)
{
   int address, incr;
   uint16 configadr;
   uint64 *p64;
   uint16 *p16;
   uint64 edat;
   uint8 eectl = context->slavelist[slave].eep_pdi;

   ecx_eeprom2master(context, slave); /* set eeprom control to master */
   configadr = context->slavelist[slave].configadr;
   address = ECT_SII_START;
   p16=(uint16*)esibuf;
   if (context->slavelist[slave].eep_8byte)
   {
      incr = 4;
   }
   else
   {
      incr = 2;
   }
   do
   {
      edat = ecx_readeepromFP(context, configadr, address, EC_TIMEOUTEEP);
      p64 = (uint64*)p16;
      *p64 = edat;
      p16 += incr;
      address += incr;
   } while ((address <= (EC_MAXEEPBUF >> 1)) && ((uint32)edat != 0xffffffff));

   if (eectl)
   {
      ecx_eeprom2pdi(context, slave); /* if eeprom control was previously pdi then restore */
   }
}